

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdumpDisassemble::BeginFunctionBody
          (BinaryReaderObjdumpDisassemble *this,Index index,Offset size)

{
  undefined8 in_RAX;
  Offset OVar1;
  mapped_type *pmVar2;
  string_view sVar3;
  mapped_type type_index;
  Index local_18;
  mapped_type local_14;
  
  _local_18 = CONCAT44((mapped_type)((ulong)in_RAX >> 0x20),index);
  if (((this->super_BinaryReaderObjdumpBase).options_)->section_offsets == false) {
    OVar1 = 0;
  }
  else {
    OVar1 = (this->super_BinaryReaderObjdumpBase).section_starts_[10];
  }
  printf("%06zx func[%u]",
         ((this->super_BinaryReaderObjdumpBase).super_BinaryReaderNop.super_BinaryReaderDelegate.
         state)->offset - OVar1,index);
  sVar3 = ObjdumpNames::Get(&((this->super_BinaryReaderObjdumpBase).objdump_state_)->function_names,
                            index);
  if (sVar3._M_len != 0) {
    printf(" <%.*s>",(ulong)(uint)sVar3._M_len,sVar3._M_str);
  }
  puts(":");
  this->last_opcode_end = 0;
  this->in_function_body = true;
  this->current_function_index = index;
  pmVar2 = std::
           map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::operator[](&((this->super_BinaryReaderObjdumpBase).objdump_state_)->function_types,
                        &local_18);
  _local_18 = CONCAT44(*pmVar2,local_18);
  pmVar2 = std::
           map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::operator[](&((this->super_BinaryReaderObjdumpBase).objdump_state_)->
                         function_param_counts,&local_14);
  this->local_index_ = *pmVar2;
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdumpDisassemble::BeginFunctionBody(Index index,
                                                         Offset size) {
  printf("%06" PRIzx " func[%" PRIindex "]", GetPrintOffset(state->offset),
         index);
  auto name = GetFunctionName(index);
  if (!name.empty()) {
    printf(" <" PRIstringview ">", WABT_PRINTF_STRING_VIEW_ARG(name));
  }
  printf(":\n");

  last_opcode_end = 0;
  in_function_body = true;
  current_function_index = index;
  auto type_index = objdump_state_->function_types[index];
  local_index_ = objdump_state_->function_param_counts[type_index];
  return Result::Ok;
}